

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

anon_struct_8_2_dd000bf7_for__M_head_impl * __thiscall
testing::internal::ValuesInIteratorRangeGenerator<(anonymous_namespace)::QuantParam>::Iterator::
Current(Iterator *this)

{
  pointer paVar1;
  anon_struct_8_2_dd000bf7_for__M_head_impl *paVar2;
  reference paVar3;
  long in_RDI;
  pointer in_stack_ffffffffffffffd8;
  unique_ptr<const_(anonymous_namespace)::QuantParam,_std::default_delete<const_(anonymous_namespace)::QuantParam>_>
  *in_stack_ffffffffffffffe0;
  
  paVar1 = std::
           unique_ptr<const_(anonymous_namespace)::QuantParam,_std::default_delete<const_(anonymous_namespace)::QuantParam>_>
           ::get(in_stack_ffffffffffffffe0);
  if (paVar1 == (pointer)0x0) {
    in_stack_ffffffffffffffe0 =
         (unique_ptr<const_(anonymous_namespace)::QuantParam,_std::default_delete<const_(anonymous_namespace)::QuantParam>_>
          *)(in_RDI + 0x18);
    paVar2 = (anon_struct_8_2_dd000bf7_for__M_head_impl *)operator_new(8);
    paVar3 = __gnu_cxx::
             __normal_iterator<const_(anonymous_namespace)::QuantParam_*,_std::vector<(anonymous_namespace)::QuantParam,_std::allocator<(anonymous_namespace)::QuantParam>_>_>
             ::operator*((__normal_iterator<const_(anonymous_namespace)::QuantParam_*,_std::vector<(anonymous_namespace)::QuantParam,_std::allocator<(anonymous_namespace)::QuantParam>_>_>
                          *)(in_RDI + 0x10));
    *paVar2 = *paVar3;
    std::
    unique_ptr<const_(anonymous_namespace)::QuantParam,_std::default_delete<const_(anonymous_namespace)::QuantParam>_>
    ::reset(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  paVar1 = std::
           unique_ptr<const_(anonymous_namespace)::QuantParam,_std::default_delete<const_(anonymous_namespace)::QuantParam>_>
           ::get(in_stack_ffffffffffffffe0);
  return paVar1;
}

Assistant:

const T* Current() const override {
      if (value_.get() == nullptr) value_.reset(new T(*iterator_));
      return value_.get();
    }